

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::set_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration,uint32_t value)

{
  mapped_type *pmVar1;
  key_type local_1c;
  
  local_1c.id = id;
  pmVar1 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->ir).meta,&local_1c);
  Bitset::set(&(pmVar1->decoration).extended.flags,decoration);
  (pmVar1->decoration).extended.values[decoration] = value;
  return;
}

Assistant:

void Compiler::set_extended_decoration(uint32_t id, ExtendedDecorations decoration, uint32_t value)
{
	auto &dec = ir.meta[id].decoration;
	dec.extended.flags.set(decoration);
	dec.extended.values[decoration] = value;
}